

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O2

void handle_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                 cio_error err,size_t bytes_transferred)

{
  cio_write_buffer *wbh;
  cio_write_buffer *new_wb;
  int iVar1;
  cio_write_buffer *new_wb_00;
  ulong uVar2;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  cio_write_buffer *write_buffer;
  
  wbh = (cio_write_buffer *)((long)handler_context + 0x50);
  new_wb_00 = cio_write_buffer_queue_dequeue(wbh);
  new_wb = (cio_write_buffer *)((long)handler_context + 0x70);
  if (err == CIO_SUCCESS) {
    while (new_wb_00 != (cio_write_buffer *)0x0) {
      uVar2 = (new_wb_00->data).element.length;
      if (bytes_transferred < uVar2) {
        if (new_wb != new_wb_00) {
          cio_write_buffer_queue_tail
                    (*(cio_write_buffer **)((long)handler_context + 0x48),new_wb_00);
          uVar2 = (new_wb_00->data).element.length;
        }
        *(size_t *)((long)handler_context + 0x80) = bytes_transferred + (new_wb_00->data).head.q_len
        ;
        *(ulong *)((long)handler_context + 0x88) = uVar2 - bytes_transferred;
        cio_write_buffer_queue_head(wbh,new_wb);
        break;
      }
      if (new_wb != new_wb_00) {
        cio_write_buffer_queue_tail(*(cio_write_buffer **)((long)handler_context + 0x48),new_wb_00);
      }
      new_wb_00 = cio_write_buffer_queue_dequeue(wbh);
      bytes_transferred = bytes_transferred - uVar2;
    }
    if (wbh->next != wbh) {
      iVar1 = (**(code **)(*handler_context + 8))(io_stream,wbh,handle_write,handler_context);
      if (iVar1 == 0) {
        return;
      }
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),iVar1,
                 *(code **)((long)handler_context + 0x38));
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)handler_context + 0x38);
    uVar3 = *(undefined8 *)((long)handler_context + 0x40);
    err = CIO_SUCCESS;
  }
  else {
    while (new_wb_00 != (cio_write_buffer *)0x0) {
      if (new_wb != new_wb_00) {
        cio_write_buffer_queue_tail(*(cio_write_buffer **)((long)handler_context + 0x48),new_wb_00);
      }
      new_wb_00 = cio_write_buffer_queue_dequeue(wbh);
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)handler_context + 0x38);
    uVar3 = *(undefined8 *)((long)handler_context + 0x40);
  }
  (*UNRECOVERED_JUMPTABLE)(handler_context,uVar3,err);
  return;
}

Assistant:

static void handle_write(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct echo_client *client = handler_context;

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "write error!\n");
		return;
	}

	cio_read_buffer_consume(&client->rb, client->number_of_bytes_read);
	struct cio_io_stream *stream = cio_socket_get_io_stream(&client->socket);
	stream->read_some(stream, &client->rb, handle_read, client);
}